

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

int consume_data(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  int iVar2;
  uint uVar3;
  jpeg_d_coef_controller *pjVar4;
  boolean bVar5;
  JBLOCKARRAY ppaJVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  JBLOCKROW paJVar17;
  JBLOCKARRAY buffer [4];
  
  pjVar4 = cinfo->coef;
  for (lVar16 = 0; lVar16 < cinfo->comps_in_scan; lVar16 = lVar16 + 1) {
    JVar1 = cinfo->cur_comp_info[lVar16]->v_samp_factor;
    ppaJVar6 = (*cinfo->mem->access_virt_barray)
                         ((j_common_ptr)cinfo,
                          (jvirt_barray_ptr)
                          (&pjVar4[3].start_output_pass)
                          [cinfo->cur_comp_info[lVar16]->component_index],
                          cinfo->input_iMCU_row * JVar1,JVar1,1);
    buffer[lVar16] = ppaJVar6;
  }
  lVar16 = (long)*(int *)((long)&pjVar4[1].start_input_pass + 4);
  do {
    if (*(int *)&pjVar4[1].consume_data <= lVar16) {
      uVar11 = cinfo->input_iMCU_row + 1;
      cinfo->input_iMCU_row = uVar11;
      if (uVar11 < cinfo->total_iMCU_rows) {
        start_iMCU_row(cinfo);
        iVar9 = 3;
      }
      else {
        (*cinfo->inputctl->finish_input_pass)(cinfo);
        iVar9 = 4;
      }
      return iVar9;
    }
    for (uVar11 = *(uint *)&pjVar4[1].start_input_pass; uVar11 < cinfo->MCUs_per_row;
        uVar11 = uVar11 + 1) {
      uVar8 = 0;
      uVar7 = (ulong)(uint)cinfo->comps_in_scan;
      if (cinfo->comps_in_scan < 1) {
        uVar7 = uVar8;
      }
      iVar9 = 0;
      for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
        iVar2 = cinfo->cur_comp_info[uVar8]->MCU_width;
        iVar12 = iVar2;
        if (iVar2 < 1) {
          iVar12 = 0;
        }
        uVar3 = cinfo->cur_comp_info[uVar8]->MCU_height;
        uVar13 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar13 = 0;
        }
        iVar14 = iVar9;
        for (uVar15 = 0; iVar14 = iVar14 + iVar12, uVar15 != uVar13; uVar15 = uVar15 + 1) {
          paJVar17 = buffer[uVar8][uVar15 + lVar16] + iVar2 * uVar11;
          for (lVar10 = (long)iVar9; iVar14 != lVar10; lVar10 = lVar10 + 1) {
            (&pjVar4[1].start_output_pass)[lVar10] = (_func_void_j_decompress_ptr *)paJVar17;
            paJVar17 = paJVar17 + 1;
          }
          iVar9 = iVar12 + iVar9;
        }
      }
      bVar5 = (*cinfo->entropy->decode_mcu)(cinfo,(JBLOCKROW *)&pjVar4[1].start_output_pass);
      if (bVar5 == 0) {
        *(int *)((long)&pjVar4[1].start_input_pass + 4) = (int)lVar16;
        *(uint *)&pjVar4[1].start_input_pass = uVar11;
        return 0;
      }
    }
    *(undefined4 *)&pjVar4[1].start_input_pass = 0;
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

METHODDEF(int)
consume_data (j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       cinfo->input_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, TRUE);
    /* Note: entropy decoder expects buffer to be zeroed,
     * but this is handled automatically by the memory manager
     * because we requested a pre-zeroed array.
     */
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	  for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
	    coef->MCU_buffer[blkn++] = buffer_ptr++;
	  }
	}
      }
      /* Try to fetch the MCU. */
      if (! (*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->MCU_ctr = MCU_col_num;
	return JPEG_SUSPENDED;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}